

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O3

bool __thiscall tinyusdz::crate::CrateReader::ReadPayload(CrateReader *this,Payload *d)

{
  pointer pPVar1;
  bool bVar2;
  ulong uVar3;
  ostream *poVar4;
  ulong uVar5;
  PathIndex index;
  string assetPath;
  optional<tinyusdz::Path> path;
  ostringstream ss_e;
  Index local_2c4;
  string local_2c0;
  long *local_2a0;
  long local_290 [2];
  string local_280;
  Path local_278;
  undefined1 local_1a8 [12];
  undefined4 uStack_19c;
  size_type local_198;
  long local_190;
  undefined1 *local_188;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_180;
  undefined1 local_178;
  undefined7 uStack_177;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_140;
  ios_base local_138 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0 [12];
  
  if (d == (Payload *)0x0) {
    return false;
  }
  local_2c0._M_string_length = 0;
  local_2c0.field_2._M_local_buf[0] = '\0';
  local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
  bVar2 = ReadString(this,&local_2c0);
  if (bVar2) {
    local_2c4.value = 0xffffffff;
    bVar2 = ReadIndex(this,&local_2c4);
    if (bVar2) {
      uVar3 = (ulong)local_2c4.value;
      pPVar1 = (this->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar5 = ((long)(this->_paths).
                     super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pPVar1 >> 4) * 0x4ec4ec4ec4ec4ec5;
      if (uVar5 < uVar3 || uVar5 - uVar3 == 0) {
        local_280 = (string)0x0;
      }
      else {
        local_1a8[0] = (string)0x1;
        Path::Path((Path *)(local_1a8 + 8),pPVar1 + uVar3);
        local_280 = local_1a8[0];
        if ((local_1a8._0_8_ & 1) != 0) {
          Path::Path(&local_278,(Path *)(local_1a8 + 8));
        }
        if (((byte)local_1a8[0] & 1) != 0) {
          if (local_100 != local_f0) {
            operator_delete(local_100,local_f0[0]._M_allocated_capacity + 1);
          }
          if (local_120 != &local_110) {
            operator_delete(local_120,local_110._M_allocated_capacity + 1);
          }
          if (local_140 != &local_130) {
            operator_delete(local_140,local_130._M_allocated_capacity + 1);
          }
          if (local_160 != &local_150) {
            operator_delete(local_160,local_150._M_allocated_capacity + 1);
          }
          if (local_180 != &local_170) {
            operator_delete(local_180,local_170._M_allocated_capacity + 1);
          }
          if ((long *)CONCAT44(uStack_19c,local_1a8._8_4_) != &local_190) {
            operator_delete((long *)CONCAT44(uStack_19c,local_1a8._8_4_),local_190 + 1);
          }
        }
      }
      if (local_280 == (string)0x0) {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                   ,0x56);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"[Crate]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"ReadPayload",0xb)
        ;
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"():",3);
        poVar4 = (ostream *)::std::ostream::operator<<((ostringstream *)local_1a8,0x420);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar4," ",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Invalid Path index in Payload ValueRep.",0x27);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
        ::std::__cxx11::stringbuf::str();
        ::std::__cxx11::string::_M_append((char *)&this->_err,(ulong)local_2a0);
        if (local_2a0 != local_290) {
          operator_delete(local_2a0,local_290[0] + 1);
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        ::std::ios_base::~ios_base(local_138);
LAB_001cc554:
        bVar2 = false;
      }
      else {
        if ((this->_version[0] != '\0') || (7 < this->_version[1])) {
          local_1a8._0_8_ = (size_type *)0x0;
          local_1a8._8_4_ = 0;
          uStack_19c = 0x3ff00000;
          bVar2 = ReadLayerOffset(this,(LayerOffset *)local_1a8);
          if (!bVar2) goto LAB_001cc554;
          *(undefined4 *)&(d->layerOffset)._offset = local_1a8._0_4_;
          *(undefined4 *)((long)&(d->layerOffset)._offset + 4) = local_1a8._4_4_;
          *(undefined4 *)&(d->layerOffset)._scale = local_1a8._8_4_;
          *(undefined4 *)((long)&(d->layerOffset)._scale + 4) = uStack_19c;
        }
        local_1a8._0_8_ = &local_198;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1a8,local_2c0._M_dataplus._M_p,
                   local_2c0._M_dataplus._M_p + local_2c0._M_string_length);
        local_180 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0;
        local_178 = 0;
        local_188 = &local_178;
        ::std::__cxx11::string::operator=((string *)d,(string *)local_1a8);
        ::std::__cxx11::string::operator=
                  ((string *)&(d->asset_path).resolved_path_,(string *)&local_188);
        if (local_188 != &local_178) {
          operator_delete(local_188,CONCAT71(uStack_177,local_178) + 1);
        }
        if ((size_type *)local_1a8._0_8_ != &local_198) {
          operator_delete((void *)local_1a8._0_8_,local_198 + 1);
        }
        if (local_280 == (string)0x0) {
          __assert_fail("has_value()",
                        "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/nonstd/optional.hpp"
                        ,0x591,
                        "value_type &nonstd::optional_lite::optional<tinyusdz::Path>::value() [T = tinyusdz::Path]"
                       );
        }
        Path::operator=(&d->prim_path,&local_278);
        bVar2 = true;
      }
      if (local_280 == (string)0x1) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._element._M_dataplus._M_p != &local_278._element.field_2) {
          operator_delete(local_278._element._M_dataplus._M_p,
                          local_278._element.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._variant_part_str._M_dataplus._M_p != &local_278._variant_part_str.field_2)
        {
          operator_delete(local_278._variant_part_str._M_dataplus._M_p,
                          local_278._variant_part_str.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._variant_selection_part._M_dataplus._M_p !=
            &local_278._variant_selection_part.field_2) {
          operator_delete(local_278._variant_selection_part._M_dataplus._M_p,
                          local_278._variant_selection_part.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._variant_part._M_dataplus._M_p != &local_278._variant_part.field_2) {
          operator_delete(local_278._variant_part._M_dataplus._M_p,
                          local_278._variant_part.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._prop_part._M_dataplus._M_p != &local_278._prop_part.field_2) {
          operator_delete(local_278._prop_part._M_dataplus._M_p,
                          local_278._prop_part.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._prim_part._M_dataplus._M_p != &local_278._prim_part.field_2) {
          operator_delete(local_278._prim_part._M_dataplus._M_p,
                          local_278._prim_part.field_2._M_allocated_capacity + 1);
        }
      }
      goto LAB_001cc2e5;
    }
  }
  bVar2 = false;
LAB_001cc2e5:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
    operator_delete(local_2c0._M_dataplus._M_p,
                    CONCAT71(local_2c0.field_2._M_allocated_capacity._1_7_,
                             local_2c0.field_2._M_local_buf[0]) + 1);
  }
  return bVar2;
}

Assistant:

bool CrateReader::ReadPayload(Payload *d) {

  if (!d) {
    return false;
  }

  // assetPath : string
  // primPath : Path

  std::string assetPath;
  if (!ReadString(&assetPath)) {
    return false;
  }


  crate::PathIndex index;
  if (!ReadIndex(&index)) {
    return false;
  }

  auto path = GetPath(index);
  if (!path) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Invalid Path index in Payload ValueRep.");
  }

  // LayerOffset from 0.8.0
  if (VersionGreaterThanOrEqualTo_0_8_0()) {
    LayerOffset layerOffset;
    if (!ReadLayerOffset(&layerOffset)) {
      return false;
    }
    d->layerOffset = layerOffset;
  }

  d->asset_path = assetPath;
  d->prim_path = path.value();

  return true;
}